

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall
QPDF::updateCache(QPDF *this,QPDFObjGen og,shared_ptr<QPDFObject> *object,
                 qpdf_offset_t end_before_space,qpdf_offset_t end_after_space,bool destroy)

{
  element_type *peVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator cVar4;
  mapped_type *o;
  QPDFObject *__tmp;
  QPDFObjGen local_40;
  QPDFObjGen local_38;
  
  peVar1 = (object->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar1->qpdf = this;
  peVar1->og = og;
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_40 = og;
  local_38 = og;
  cVar4 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::find(&((_Var2._M_head_impl)->obj_cache)._M_t,&local_38);
  if (cVar4._M_node == (_Base_ptr)((long)&(_Var2._M_head_impl)->obj_cache + 8U)) {
    peVar1 = (object->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var3 = (object->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    o = std::
        map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
        ::operator[](&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                     &local_40);
    (o->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    this_00 = (o->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (o->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    o = std::
        map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
        ::operator[](&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                     &local_40);
    QPDFObject::move_to((object->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                        &o->object,destroy);
  }
  o->end_before_space = end_before_space;
  o->end_after_space = end_after_space;
  return;
}

Assistant:

void
QPDF::updateCache(
    QPDFObjGen og,
    std::shared_ptr<QPDFObject> const& object,
    qpdf_offset_t end_before_space,
    qpdf_offset_t end_after_space,
    bool destroy)
{
    object->setObjGen(this, og);
    if (isCached(og)) {
        auto& cache = m->obj_cache[og];
        object->move_to(cache.object, destroy);
        cache.end_before_space = end_before_space;
        cache.end_after_space = end_after_space;
    } else {
        m->obj_cache[og] = ObjCache(object, end_before_space, end_after_space);
    }
}